

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::printInfo(Cache *this,bool verbose)

{
  undefined8 in_RAX;
  pointer pBVar1;
  ulong uVar2;
  long lVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  puts("---------- Cache Info -----------");
  printf("Cache Size: %d bytes\n",(ulong)(this->policy).cacheSize);
  printf("Block Size: %d bytes\n",(ulong)(this->policy).blockSize);
  printf("Block Num: %d\n",(ulong)(this->policy).blockNum);
  printf("Associativiy: %d\n",(ulong)(this->policy).associativity);
  printf("Hit Latency: %d\n",(ulong)(this->policy).hitLatency);
  printf("Miss Latency: %d\n",(ulong)(this->policy).missLatency);
  if (((int)CONCAT71(in_register_00000031,verbose) != 0) &&
     (pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start,
     (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
     super__Vector_impl_data._M_finish != pBVar1)) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      pcVar4 = "invalid";
      if ((&pBVar1->valid)[lVar3] != false) {
        pcVar4 = "valid";
      }
      pcVar5 = "unmodified";
      if ((&pBVar1->modified)[lVar3] != false) {
        pcVar5 = "modified";
      }
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),
                        *(undefined4 *)((long)&pBVar1->lastReference + lVar3));
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n",uVar6 & 0xffffffff,
             (ulong)*(uint *)((long)&pBVar1->tag + lVar3),
             (ulong)*(uint *)((long)&pBVar1->id + lVar3),pcVar4,pcVar5,in_RAX);
      uVar6 = uVar6 + 1;
      pBVar1 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4) *
              -0x5555555555555555;
      lVar3 = lVar3 + 0x30;
    } while (uVar6 <= uVar2 && uVar2 - uVar6 != 0);
  }
  return;
}

Assistant:

void Cache::printInfo(bool verbose) {
  printf("---------- Cache Info -----------\n");
  printf("Cache Size: %d bytes\n", this->policy.cacheSize);
  printf("Block Size: %d bytes\n", this->policy.blockSize);
  printf("Block Num: %d\n", this->policy.blockNum);
  printf("Associativiy: %d\n", this->policy.associativity);
  printf("Hit Latency: %d\n", this->policy.hitLatency);
  printf("Miss Latency: %d\n", this->policy.missLatency);

  if (verbose) {
    for (int j = 0; j < this->blocks.size(); ++j) {
      const Block &b = this->blocks[j];
      printf("Block %d: tag 0x%x id %d %s %s (last ref %d)\n", j, b.tag, b.id,
             b.valid ? "valid" : "invalid",
             b.modified ? "modified" : "unmodified", b.lastReference);
      // printf("Data: ");
      // for (uint8_t d : b.data)
      // printf("%d ", d);
      // printf("\n");
    }
  }
}